

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O3

lzma_ret lzma_index_cat(lzma_index *dest,lzma_index *src,lzma_allocator *allocator)

{
  lzma_vli lVar1;
  lzma_vli vli;
  lzma_vli lVar2;
  lzma_vli lVar3;
  index_tree_node *piVar4;
  index_tree_node *ptr;
  index_tree_node *piVar5;
  lzma_vli lVar6;
  lzma_vli lVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint uVar10;
  lzma_vli lVar11;
  lzma_vli lVar12;
  long lVar13;
  index_tree_node *piVar14;
  lzma_ret lVar15;
  undefined1 *puVar16;
  index_cat_info info;
  index_cat_info local_58;
  
  lVar11 = lzma_index_file_size(dest);
  lVar12 = lzma_index_file_size(src);
  lVar15 = LZMA_DATA_ERROR;
  if (-1 < (long)(lVar12 + lVar11)) {
    lVar12 = dest->uncompressed_size;
    lVar1 = src->uncompressed_size;
    if (-1 < (long)(lVar1 + lVar12)) {
      vli = dest->record_count;
      lVar2 = dest->index_list_size;
      uVar8 = lzma_vli_size(vli);
      lVar6 = src->record_count;
      lVar7 = src->index_list_size;
      lVar3 = src->index_list_size;
      uVar9 = lzma_vli_size(src->record_count);
      lVar13 = (ulong)(uVar9 + 1) + (uVar8 + 1) + lVar2 + lVar3;
      if (lVar13 + 8 < 0) {
        __assert_fail("vli <= LZMA_VLI_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/index.h"
                      ,0x29,"lzma_vli vli_ceil4(lzma_vli)");
      }
      if ((lVar13 + 0xbU & 0xfffffffffffffffc) < 0x400000001) {
        piVar4 = (dest->streams).rightmost;
        ptr = piVar4[1].right;
        if ((ptr != (index_tree_node *)0x0) &&
           (puVar16 = (undefined1 *)((long)&(ptr[1].parent)->uncompressed_base + 1),
           puVar16 < (undefined1 *)ptr[1].compressed_base)) {
          if (ptr->left != (index_tree_node *)0x0) {
            __assert_fail("g->node.left == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/index.c"
                          ,799,
                          "lzma_ret lzma_index_cat(lzma_index *restrict, lzma_index *restrict, const lzma_allocator *)"
                         );
          }
          if (ptr->right != (index_tree_node *)0x0) {
            __assert_fail("g->node.right == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/index.c"
                          ,800,
                          "lzma_ret lzma_index_cat(lzma_index *restrict, lzma_index *restrict, const lzma_allocator *)"
                         );
          }
          piVar14 = (index_tree_node *)lzma_alloc((long)puVar16 * 0x10 + 0x40,allocator);
          if (piVar14 == (index_tree_node *)0x0) {
            return LZMA_MEM_ERROR;
          }
          piVar14->right = ptr->right;
          lVar2 = ptr->uncompressed_base;
          lVar3 = ptr->compressed_base;
          piVar5 = ptr->left;
          piVar14->parent = ptr->parent;
          piVar14->left = piVar5;
          piVar14->uncompressed_base = lVar2;
          piVar14->compressed_base = lVar3;
          piVar5 = ptr[1].parent;
          puVar16 = (undefined1 *)((long)&piVar5->uncompressed_base + 1);
          piVar14[1].compressed_base = (lzma_vli)puVar16;
          piVar14[1].parent = piVar5;
          piVar14[1].uncompressed_base = ptr[1].uncompressed_base;
          memcpy(&piVar14[1].left,&ptr[1].left,(long)puVar16 * 0x10);
          piVar5 = ptr->parent;
          if (piVar5 != (index_tree_node *)0x0) {
            if (piVar5->right != ptr) {
              __assert_fail("g->node.parent->right == &g->node",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/index.c"
                            ,0x332,
                            "lzma_ret lzma_index_cat(lzma_index *restrict, lzma_index *restrict, const lzma_allocator *)"
                           );
            }
            piVar5->right = piVar14;
          }
          if (piVar4[1].left == ptr) {
            if (piVar4[1].parent != ptr) {
              __assert_fail("s->groups.root == &g->node",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/index.c"
                            ,0x337,
                            "lzma_ret lzma_index_cat(lzma_index *restrict, lzma_index *restrict, const lzma_allocator *)"
                           );
            }
            piVar4[1].left = piVar14;
            piVar4[1].parent = piVar14;
          }
          if (piVar4[1].right != ptr) {
            __assert_fail("s->groups.rightmost == &g->node",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/index.c"
                          ,0x33c,
                          "lzma_ret lzma_index_cat(lzma_index *restrict, lzma_index *restrict, const lzma_allocator *)"
                         );
          }
          piVar4[1].right = piVar14;
          lzma_free(ptr,allocator);
        }
        local_58.stream_number_add = (dest->streams).count;
        local_58.uncompressed_size = lVar12;
        local_58.file_size = lVar11;
        local_58.block_number_add = vli;
        local_58.streams = &dest->streams;
        index_cat_helper(&local_58,(index_stream *)(src->streams).root);
        dest->uncompressed_size = dest->uncompressed_size + lVar1;
        dest->total_size = dest->total_size + src->total_size;
        dest->record_count = dest->record_count + lVar6;
        dest->index_list_size = dest->index_list_size + lVar7;
        uVar10 = dest->checks;
        piVar4 = (dest->streams).rightmost;
        if (*(int *)&piVar4[2].left != -1) {
          uVar10 = uVar10 | 1 << ((byte)piVar4[3].uncompressed_base & 0x1f);
        }
        dest->checks = uVar10 | src->checks;
        lzma_free(src,allocator);
        lVar15 = LZMA_OK;
      }
    }
  }
  return lVar15;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_index_cat(lzma_index *restrict dest, lzma_index *restrict src,
		const lzma_allocator *allocator)
{
	const lzma_vli dest_file_size = lzma_index_file_size(dest);

	// Check that we don't exceed the file size limits.
	if (dest_file_size + lzma_index_file_size(src) > LZMA_VLI_MAX
			|| dest->uncompressed_size + src->uncompressed_size
				> LZMA_VLI_MAX)
		return LZMA_DATA_ERROR;

	// Check that the encoded size of the combined lzma_indexes stays
	// within limits. In theory, this should be done only if we know
	// that the user plans to actually combine the Streams and thus
	// construct a single Index (probably rare). However, exceeding
	// this limit is quite theoretical, so we do this check always
	// to simplify things elsewhere.
	{
		const lzma_vli dest_size = index_size_unpadded(
				dest->record_count, dest->index_list_size);
		const lzma_vli src_size = index_size_unpadded(
				src->record_count, src->index_list_size);
		if (vli_ceil4(dest_size + src_size) > LZMA_BACKWARD_SIZE_MAX)
			return LZMA_DATA_ERROR;
	}

	// Optimize the last group to minimize memory usage. Allocation has
	// to be done before modifying dest or src.
	{
		index_stream *s = (index_stream *)(dest->streams.rightmost);
		index_group *g = (index_group *)(s->groups.rightmost);
		if (g != NULL && g->last + 1 < g->allocated) {
			assert(g->node.left == NULL);
			assert(g->node.right == NULL);

			index_group *newg = lzma_alloc(sizeof(index_group)
					+ (g->last + 1)
					* sizeof(index_record),
					allocator);
			if (newg == NULL)
				return LZMA_MEM_ERROR;

			newg->node = g->node;
			newg->allocated = g->last + 1;
			newg->last = g->last;
			newg->number_base = g->number_base;

			memcpy(newg->records, g->records, newg->allocated
					* sizeof(index_record));

			if (g->node.parent != NULL) {
				assert(g->node.parent->right == &g->node);
				g->node.parent->right = &newg->node;
			}

			if (s->groups.leftmost == &g->node) {
				assert(s->groups.root == &g->node);
				s->groups.leftmost = &newg->node;
				s->groups.root = &newg->node;
			}

			assert(s->groups.rightmost == &g->node);
			s->groups.rightmost = &newg->node;

			lzma_free(g, allocator);

			// NOTE: newg isn't leaked here because
			// newg == (void *)&newg->node.
		}
	}

	// Add all the Streams from src to dest. Update the base offsets
	// of each Stream from src.
	const index_cat_info info = {
		.uncompressed_size = dest->uncompressed_size,
		.file_size = dest_file_size,
		.stream_number_add = dest->streams.count,
		.block_number_add = dest->record_count,
		.streams = &dest->streams,
	};
	index_cat_helper(&info, (index_stream *)(src->streams.root));

	// Update info about all the combined Streams.
	dest->uncompressed_size += src->uncompressed_size;
	dest->total_size += src->total_size;
	dest->record_count += src->record_count;
	dest->index_list_size += src->index_list_size;
	dest->checks = lzma_index_checks(dest) | src->checks;

	// There's nothing else left in src than the base structure.
	lzma_free(src, allocator);

	return LZMA_OK;
}